

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  char *__s;
  cmAlphaNum local_78;
  cmAlphaNum local_48;
  
  __s = ObjectKindName::objectKindNames[*(int *)&this->CMakeInstance];
  local_48.View_._M_len = strlen(__s);
  local_78.View_._M_len = 2;
  local_78.View_._M_str = "-v";
  local_48.View_._M_str = __s;
  cmStrCat<unsigned_long>(__return_storage_ptr__,&local_48,&local_78,(unsigned_long *)&this->APIv1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = cmStrCat(ObjectKindName(o.Kind), "-v", o.Version);
  return name;
}